

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

void __thiscall
DecHeap::DecHeap(DecHeap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *heap)

{
  pointer puVar1;
  pointer ppVar2;
  pointer ppVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  ulong local_28;
  
  (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28 = 0;
  while( true ) {
    puVar1 = (heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= local_28)
    break;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long_const&,unsigned_long&>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)this,puVar1 + local_28,&local_28);
    local_28 = local_28 + 1;
  }
  std::
  make_heap<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,std::greater<std::pair<unsigned_long,unsigned_long>>>
            ((this->heap).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->heap).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->idx_map,
             (long)(heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(heap->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  ppVar2 = (this->heap).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->heap).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = &ppVar2->second;
  for (uVar5 = 0; (long)ppVar3 - (long)ppVar2 >> 4 != uVar5; uVar5 = uVar5 + 1) {
    puVar1[*puVar4] = uVar5;
    puVar4 = puVar4 + 2;
  }
  return;
}

Assistant:

DecHeap::DecHeap(const std::vector<size_t> &heap) {
    for (size_t i = 0; i < heap.size(); ++i) {
        this->heap.emplace_back(heap[i], i);
    }
    std::make_heap(this->heap.begin(), this->heap.end(), std::greater<std::pair<size_t, size_t>>());
    this->idx_map.resize(heap.size());
    for (size_t i = 0; i < this->heap.size(); ++i) {
        this->idx_map[this->heap[i].second] = i;
    }
}